

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_queue_tail_multiple.h
# Opt level: O1

ControlBlock * __thiscall
density::detail::
SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
::create_page(SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
              *this,LfQueue_ProgressGuarantee i_progress_guarantee)

{
  uintptr_t uint_pointer;
  ControlBlock *pCVar1;
  progress_guarantee i_progress_guarantee_00;
  long *in_FS_OFFSET;
  
  if (i_progress_guarantee == LfQueue_Throwing) {
    pCVar1 = (ControlBlock *)
             basic_default_allocator<65536UL>::allocate_page
                       ((basic_default_allocator<65536UL> *)this);
  }
  else {
    PageAllocator<density::detail::SystemPageManager<65536ul>>::t_instance::__tls_init();
    i_progress_guarantee_00 = progress_blocking;
    if (i_progress_guarantee != LfQueue_Blocking) {
      i_progress_guarantee_00 = i_progress_guarantee == LfQueue_LockFree ^ progress_wait_free;
    }
    pCVar1 = (ControlBlock *)
             PageAllocator<density::detail::SystemPageManager<65536UL>_>::
             try_allocate_page<(density::detail::page_allocation_type)0>
                       ((PageAllocator<density::detail::SystemPageManager<65536UL>_> *)
                        (*in_FS_OFFSET + -0xc0),i_progress_guarantee_00);
  }
  if (pCVar1 != (ControlBlock *)0x0) {
    LOCK();
    *(undefined8 *)(((ulong)pCVar1 & 0xffffffffffff0000) + 0xffc0) = 8;
    UNLOCK();
    LOCK();
    pCVar1->m_next = 0;
    UNLOCK();
  }
  return pCVar1;
}

Assistant:

ControlBlock * create_page(LfQueue_ProgressGuarantee i_progress_guarantee)
            {
                auto const new_page = static_cast<ControlBlock *>(
                  i_progress_guarantee == LfQueue_Throwing
                    ? ALLOCATOR_TYPE::allocate_page()
                    : ALLOCATOR_TYPE::try_allocate_page(ToDenGuarantee(i_progress_guarantee)));
                if (new_page)
                {
                    auto const new_page_end_block = get_end_control_block(new_page);
                    raw_atomic_store(
                      &new_page_end_block->m_next, uintptr_t(LfQueue_InvalidNextPage));

                    raw_atomic_store(&new_page->m_next, uintptr_t(0), mem_release);
                }
                return new_page;
            }